

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall
miniros::MasterLink::setParamImpl<bool>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map)

{
  XmlRpcValue *this_00;
  _Rb_tree_node_base *p_Var1;
  RpcValue xml_value;
  XmlRpcValue local_38;
  
  local_38._type = TypeInvalid;
  local_38._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::begin_abi_cxx11_(&local_38);
  for (p_Var1 = *(_Rb_tree_node_base **)(map + 0x18); p_Var1 != (_Rb_tree_node_base *)(map + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = XmlRpc::XmlRpcValue::operator[](&local_38,(string *)(p_Var1 + 1));
    XmlRpc::XmlRpcValue::operator=(this_00,(bool *)(p_Var1 + 2));
  }
  set(this,key,&local_38);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_38);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::map<std::string, T>& map)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertStruct turns it
  // into a struct type
  RpcValue xml_value;
  xml_value.begin();

  // Copy the contents into the XmlRpcValue
  for (typename std::map<std::string, T>::const_iterator it = map.begin(); it != map.end(); ++it) {
    xml_value[it->first] = it->second;
  }

  this->set(key, xml_value);
}